

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceStub.cpp
# Opt level: O1

bool __thiscall irr::CIrrDeviceStub::postEventFromUser(CIrrDeviceStub *this,SEvent *event)

{
  IEventReceiver *pIVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  ISceneManager *pIVar5;
  
  pIVar1 = this->UserReceiver;
  if (pIVar1 == (IEventReceiver *)0x0) {
    cVar3 = '\0';
  }
  else {
    iVar4 = (*pIVar1->_vptr_IEventReceiver[2])(pIVar1,event);
    cVar3 = (char)iVar4;
  }
  if ((cVar3 == '\0') &&
     (plVar2 = *(long **)&(this->super_IrrlichtDevice).field_0x10, plVar2 != (long *)0x0)) {
    cVar3 = (**(code **)(*plVar2 + 0x50))(plVar2,event);
  }
  pIVar5 = this->InputReceivingSceneManager;
  if (pIVar5 == (ISceneManager *)0x0) {
    pIVar5 = *(ISceneManager **)&(this->super_IrrlichtDevice).field_0x18;
  }
  if (pIVar5 != (ISceneManager *)0x0 && cVar3 == '\0') {
    iVar4 = (*pIVar5->_vptr_ISceneManager[0x19])(pIVar5,event);
    cVar3 = (char)iVar4;
  }
  return (bool)cVar3;
}

Assistant:

bool CIrrDeviceStub::postEventFromUser(const SEvent &event)
{
	bool absorbed = false;

	if (UserReceiver)
		absorbed = UserReceiver->OnEvent(event);

	if (!absorbed && GUIEnvironment)
		absorbed = GUIEnvironment->postEventFromUser(event);

	scene::ISceneManager *inputReceiver = InputReceivingSceneManager;
	if (!inputReceiver)
		inputReceiver = SceneManager;

	if (!absorbed && inputReceiver)
		absorbed = inputReceiver->postEventFromUser(event);

	return absorbed;
}